

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_decomposition.cpp
# Opt level: O0

void qRDecomposition(MatrixXd *A,MatrixXd *Q,MatrixXd *R)

{
  non_const_type local_140;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_138;
  HouseholderSequenceType local_128;
  Type local_100;
  HouseholderSequenceType local_e8;
  undefined1 local_c0 [8];
  HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> householderQR;
  Index local_70;
  Index local_68;
  undefined1 local_60 [8];
  MatrixXd q;
  Index local_40;
  undefined1 local_38 [8];
  MatrixXd thinQ;
  MatrixXd *R_local;
  MatrixXd *Q_local;
  MatrixXd *A_local;
  
  thinQ.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = (Index)R
  ;
  local_40 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                       (&A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                 (&A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_38,&local_40,
             &q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  local_68 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                       (&A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  local_70 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                       (&A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_60,&local_68,&local_70);
  Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_c0,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)A);
  Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::householderQ
            (&local_e8,(HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_c0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)local_60,
             (EigenBase<Eigen::HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
              *)&local_e8);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38);
  Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::householderQ
            (&local_128,(HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_c0);
  Eigen::
  HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>::
  operator*(&local_100,
            (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
             *)&local_128,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(Q,&local_100);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_100);
  local_140 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Q);
  local_138 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                         &local_140,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)A);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)
             thinQ.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
             ,(DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
               *)&local_138);
  Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR
            ((HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_c0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_60);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_38);
  return;
}

Assistant:

void qRDecomposition(Eigen::MatrixXd &A,Eigen::MatrixXd &Q, Eigen::MatrixXd &R)
{
    /*
        A=QR
        Q: is orthogonal matrix-> columns of Q are orthonormal
        R: is upper triangulate matrix
        this is possible when columns of A are linearly indipendent
    */

    Eigen::MatrixXd thinQ(A.rows(),A.cols() ), q(A.rows(),A.rows());

    Eigen::HouseholderQR<Eigen::MatrixXd> householderQR(A);
    q = householderQR.householderQ();
    thinQ.setIdentity();
    Q = householderQR.householderQ() * thinQ;
    R=Q.transpose()*A;
}